

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

size_t __thiscall CoreML::Specification::Scaler::ByteSizeLong(Scaler *this)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  
  uVar2 = (ulong)(uint)(this->shiftvalue_).current_size_;
  if (uVar2 == 0) {
    lVar4 = 0;
  }
  else {
    uVar3 = ((long)(uVar2 << 0x23) >> 0x20) + 1;
    lVar4 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    lVar4 = (ulong)((int)lVar4 * 9 + 0x49U >> 6) + 1;
  }
  lVar4 = lVar4 + uVar2 * 8;
  uVar2 = (ulong)(uint)(this->scalevalue_).current_size_;
  if (uVar2 != 0) {
    uVar3 = ((long)(uVar2 << 0x23) >> 0x20) + 1;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    lVar4 = lVar4 + (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = lVar4 + uVar2 * 8;
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}